

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t *psVar1;
  size_type *psVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  SectionTracker *pSVar9;
  undefined4 extraout_var;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string local_1d8;
  string local_1b8;
  Totals local_198;
  TestCaseStats local_160;
  
  local_198.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_198.error = (this->m_totals).error;
  local_198._4_4_ = *(undefined4 *)&(this->m_totals).field_0x4;
  local_198.assertions.passed = (this->m_totals).assertions.passed;
  local_198.assertions.failed = (this->m_totals).assertions.failed;
  local_198.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_198.testCases.passed._0_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_198.testCases.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_198.testCases.failed._0_4_ = (undefined4)(this->m_totals).testCases.failed;
  local_198.testCases.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar3->_vptr_IStreamingReporter[7])(pIVar3,testCase);
  this->m_activeTestCase = testCase;
  pSVar9 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  iVar8 = (*(pSVar9->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])(pSVar9);
  if ((char)iVar8 == '\0') {
    __assert_fail("rootTracker.isSectionTracker()",
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x31d2,"Totals Catch::RunContext::runTest(const TestCase &)");
  }
  iVar8 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar8));
  psVar2 = &local_160.testInfo.name._M_string_length;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar4 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_160._vptr_TestCaseStats = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar4,
               pcVar4 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_160.testInfo.name.field_2._8_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    local_160.testInfo.className._M_dataplus._M_p =
         (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar9 = TestCaseTracking::SectionTracker::acquire
                       (&this->m_trackerContext,(NameAndLocation *)&local_160);
    this->m_testCaseTracker = (ITracker *)pSVar9;
    if (local_160._vptr_TestCaseStats != (_func_int **)psVar2) {
      operator_delete(local_160._vptr_TestCaseStats);
    }
    runCurrentTest(this,&local_1b8,&local_1d8);
    iVar8 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar8 != '\0') break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar8 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar5 < (ulong)(long)iVar8);
  Totals::delta(__return_storage_ptr__,&this->m_totals,&local_198);
  sVar6 = (__return_storage_ptr__->testCases).passed;
  if ((sVar6 != 0 & (byte)(char)(testCase->super_TestCaseInfo).properties >> 2) == 1) {
    psVar1 = &(__return_storage_ptr__->assertions).failed;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->testCases).passed = sVar6 - 1;
    psVar1 = &(__return_storage_ptr__->testCases).failed;
    *psVar1 = *psVar1 + 1;
  }
  sVar6 = (__return_storage_ptr__->testCases).failed;
  sVar7 = (this->m_totals).testCases.failed;
  (this->m_totals).testCases.passed =
       (this->m_totals).testCases.passed + (__return_storage_ptr__->testCases).passed;
  (this->m_totals).testCases.failed = sVar7 + sVar6;
  psVar1 = &(this->m_totals).testCases.failedButOk;
  *psVar1 = *psVar1 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  uVar5 = (this->m_totals).assertions.failed;
  iVar8 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            (&local_160,&testCase->super_TestCaseInfo,__return_storage_ptr__,&local_1b8,&local_1d8,
             (ulong)(long)iVar8 <= uVar5);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,&local_160);
  TestCaseStats::~TestCaseStats(&local_160);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }